

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,bool *args_1,
          span<const_slang::ast::Expression_*const,_18446744073709551615UL> *args_2,
          SourceRange *args_3)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elements;
  SimpleAssignmentPatternExpression *pSVar1;
  SimpleAssignmentPatternExpression *in_RCX;
  pointer in_RDX;
  __extent_storage<18446744073709551615UL> in_RSI;
  Type *in_R8;
  SourceRange in_stack_00000000;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pSVar1 = (SimpleAssignmentPatternExpression *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  elements._M_extent._M_extent_value = in_RSI._M_extent_value;
  elements._M_ptr = in_RDX;
  slang::ast::SimpleAssignmentPatternExpression::SimpleAssignmentPatternExpression
            (in_RCX,in_R8,
             SUB81((ulong)(in_RCX->super_AssignmentPatternExpressionBase).super_Expression.type.ptr
                   >> 0x38,0),elements,in_stack_00000000);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }